

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack9_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = *(ulong *)in;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar6 = vpshufd_avx(auVar4,0x54);
  auVar4 = vpinsrd_avx(auVar4,(uint)(uVar1 >> 9) & 0x7fffff,1);
  auVar5._8_4_ = 0x1ff;
  auVar5._0_8_ = 0x1ff000001ff;
  auVar5._12_4_ = 0x1ff;
  auVar4 = vpand_avx(auVar4,auVar5);
  *(long *)out = auVar4._0_8_;
  out[2] = (uint)uVar1 >> 0x12 & 0x1ff;
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_0019fef0);
  uVar2 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar5,(uVar2 & 0xf) << 5,0);
  auVar6 = vpor_avx(auVar7,auVar4);
  auVar4 = vpand_avx(auVar7,auVar5);
  auVar4 = vpblendd_avx2(auVar4,auVar6,1);
  *(undefined1 (*) [16])(out + 3) = auVar4;
  out[7] = uVar2 >> 0x1f;
  uVar1 = *(ulong *)(in + 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6 = vpshufd_avx(auVar6,0x54);
  out[7] = uVar2 >> 0x1f | ((uint)uVar1 & 0xff) << 1;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_0019ff00);
  auVar4 = vpand_avx(auVar4,auVar5);
  *(long *)(out + 8) = auVar4._0_8_;
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_0019ff10);
  uVar2 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar5,(uVar2 & 7) << 6,0);
  auVar6 = vpor_avx(auVar7,auVar4);
  auVar4 = vpand_avx(auVar7,auVar5);
  auVar4 = vpblendd_avx2(auVar4,auVar6,1);
  *(undefined1 (*) [16])(out + 10) = auVar4;
  out[0xe] = uVar2 >> 0x1e;
  uVar1 = *(ulong *)(in + 4);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar6 = vpshufd_avx(auVar7,0x54);
  out[0xe] = uVar2 >> 0x1e | ((uint)uVar1 & 0x7f) << 2;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_0019ff20);
  auVar4 = vpand_avx(auVar4,auVar5);
  *(long *)(out + 0xf) = auVar4._0_8_;
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_0019ff30);
  uVar2 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar5,(uVar2 & 3) << 7,0);
  auVar6 = vpor_avx(auVar7,auVar4);
  auVar4 = vpand_avx(auVar7,auVar5);
  auVar4 = vpblendd_avx2(auVar4,auVar6,1);
  *(undefined1 (*) [16])(out + 0x11) = auVar4;
  out[0x15] = uVar2 >> 0x1d;
  uVar1 = *(ulong *)(in + 6);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar6 = vpshufd_avx(auVar8,0x54);
  out[0x15] = uVar2 >> 0x1d | ((uint)uVar1 & 0x3f) << 3;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_0019ff40);
  auVar4 = vpand_avx(auVar4,auVar5);
  *(long *)(out + 0x16) = auVar4._0_8_;
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_0019ff50);
  uVar3 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar5,(uVar3 & 1) << 8,0);
  auVar6 = vpor_avx(auVar7,auVar4);
  auVar4 = vpand_avx(auVar7,auVar5);
  auVar4 = vpblendd_avx2(auVar4,auVar6,1);
  *(undefined1 (*) [16])(out + 0x18) = auVar4;
  uVar2 = in[8];
  out[0x1c] = uVar3 >> 0x1c;
  out[0x1c] = uVar3 >> 0x1c | (uVar2 & 0x1f) << 4;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_0019ff60);
  auVar4 = vpand_avx(auVar4,auVar5);
  *(long *)(out + 0x1d) = auVar4._0_8_;
  out[0x1f] = uVar2 >> 0x17;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack9_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 9);
  out++;
  *out = ((*in) >> 17) % (1U << 9);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 3)) << (9 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 9);
  out++;
  *out = ((*in) >> 12) % (1U << 9);
  out++;
  *out = ((*in) >> 21) % (1U << 9);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 7)) << (9 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 9);
  out++;
  *out = ((*in) >> 16) % (1U << 9);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 2)) << (9 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 9);
  out++;
  *out = ((*in) >> 11) % (1U << 9);
  out++;
  *out = ((*in) >> 20) % (1U << 9);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 6)) << (9 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 9);
  out++;
  *out = ((*in) >> 15) % (1U << 9);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 1)) << (9 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 9);
  out++;
  *out = ((*in) >> 10) % (1U << 9);
  out++;
  *out = ((*in) >> 19) % (1U << 9);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 5)) << (9 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 9);
  out++;
  *out = ((*in) >> 14) % (1U << 9);
  out++;
  *out = ((*in) >> 23);
  ++in;
  out++;

  return in;
}